

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryResolveThenableTaskFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *pJVar2;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *pJVar3;
  bool bVar4;
  int n;
  CallFlags e;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Recycler *pRVar8;
  JavascriptPromiseResolveOrRejectFunction *pJVar9;
  JavascriptPromiseResolveOrRejectFunction *handler;
  JavascriptMethod p_Var10;
  JavascriptException *err;
  CallInfo local_10c [2];
  undefined1 local_f8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  AutoCatchHandlerExists autoCatchHandlerExists;
  bool isPromiseRejectionHandled;
  JavascriptExceptionObject *exception;
  JavascriptPromiseResolveOrRejectFunction *reject;
  JavascriptPromiseResolveOrRejectFunction *resolve;
  TrackAllocData local_a8;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *local_80;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord;
  RecyclableObject *thenFunction;
  RecyclableObject *thenable;
  JavascriptPromise *promise;
  JavascriptPromiseResolveThenableTaskFunction *resolveThenableTaskFunction;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x5e7,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x5e8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  library = (JavascriptLibrary *)RecyclableObject::GetScriptContext(function);
  resolveThenableTaskFunction =
       (JavascriptPromiseResolveThenableTaskFunction *)
       ScriptContext::GetLibrary((ScriptContext *)library);
  promise = (JavascriptPromise *)
            VarTo<Js::JavascriptPromiseResolveThenableTaskFunction,Js::RecyclableObject>(function);
  thenable = (RecyclableObject *)
             JavascriptPromiseResolveThenableTaskFunction::GetPromise
                       ((JavascriptPromiseResolveThenableTaskFunction *)promise);
  thenFunction = JavascriptPromiseResolveThenableTaskFunction::GetThenable
                           ((JavascriptPromiseResolveThenableTaskFunction *)promise);
  alreadyResolvedRecord =
       (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
       JavascriptPromiseResolveThenableTaskFunction::GetThenFunction
                 ((JavascriptPromiseResolveThenableTaskFunction *)promise);
  pRVar8 = ScriptContext::GetRecycler((ScriptContext *)library);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a8,
             (type_info *)&JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo,
             0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
             ,0x5f2);
  pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_a8);
  local_80 = (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
             new<Memory::Recycler>(1,pRVar8,0x744a10);
  local_80->alreadyResolved = false;
  pJVar9 = JavascriptLibrary::CreatePromiseResolveOrRejectFunction
                     ((JavascriptLibrary *)resolveThenableTaskFunction,EntryResolveOrRejectFunction,
                      (JavascriptPromise *)thenable,false,local_80);
  handler = JavascriptLibrary::CreatePromiseResolveOrRejectFunction
                      ((JavascriptLibrary *)resolveThenableTaskFunction,EntryResolveOrRejectFunction
                       ,(JavascriptPromise *)thenable,true,local_80);
  autoCatchHandlerExists.m_threadContext._7_1_ = true;
  bVar4 = ScriptContext::IsScriptContextInDebugMode((ScriptContext *)library);
  if (bVar4) {
    bVar4 = WillRejectionBeUnhandled((JavascriptPromise *)thenable);
    autoCatchHandlerExists.m_threadContext._7_1_ = (bool)((bVar4 ^ 0xffU) & 1);
  }
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled,
             (ScriptContext *)library,autoCatchHandlerExists.m_threadContext._7_1_);
  pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)library);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_f8,pTVar6);
  pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)library);
  ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar6);
  pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)library);
  ThreadContext::AssertJsReentrancy(pTVar6);
  pJVar2 = alreadyResolvedRecord;
  p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)alreadyResolvedRecord);
  CheckIsExecutable((RecyclableObject *)pJVar2,p_Var10);
  p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)alreadyResolvedRecord);
  pJVar2 = alreadyResolvedRecord;
  CallInfo::CallInfo(local_10c,CallFlags_Value,3);
  pJVar3 = alreadyResolvedRecord;
  CallInfo::CallInfo((CallInfo *)((long)&err + 4),CallFlags_Value,3);
  callInfo_local =
       (CallInfo)
       (*p_Var10)((RecyclableObject *)pJVar2,(CallInfo)pJVar3,local_10c[0],0,0,0,0,
                  stack0xfffffffffffffeec,thenFunction,pJVar9,handler);
  err._0_4_ = 1;
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_f8);
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  if ((int)err == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x615,"(exception != nullptr)","exception != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    callInfo_local =
         (CallInfo)
         TryRejectWithExceptionObject
                   ((JavascriptExceptionObject *)0x0,handler,(ScriptContext *)library);
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptPromise::EntryResolveThenableTaskFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        JavascriptPromiseResolveThenableTaskFunction* resolveThenableTaskFunction = VarTo<JavascriptPromiseResolveThenableTaskFunction>(function);
        JavascriptPromise* promise = resolveThenableTaskFunction->GetPromise();
        RecyclableObject* thenable = resolveThenableTaskFunction->GetThenable();
        RecyclableObject* thenFunction = resolveThenableTaskFunction->GetThenFunction();

        JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
        alreadyResolvedRecord->alreadyResolved = false;

        JavascriptPromiseResolveOrRejectFunction* resolve = library->CreatePromiseResolveOrRejectFunction(EntryResolveOrRejectFunction, promise, false, alreadyResolvedRecord);
        JavascriptPromiseResolveOrRejectFunction* reject = library->CreatePromiseResolveOrRejectFunction(EntryResolveOrRejectFunction, promise, true, alreadyResolvedRecord);
        JavascriptExceptionObject* exception = nullptr;

        {
            bool isPromiseRejectionHandled = true;
            if (scriptContext->IsScriptContextInDebugMode())
            {
                // only necessary to determine if false if debugger is attached.  This way we'll
                // correctly break on exceptions raised in promises that result in uhandled rejections
                isPromiseRejectionHandled = !promise->WillRejectionBeUnhandled();
            }

            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext, isPromiseRejectionHandled);
            try
            {
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    return CALL_FUNCTION(scriptContext->GetThreadContext(),
                            thenFunction, Js::CallInfo(Js::CallFlags::CallFlags_Value, 3),
                            thenable,
                            resolve,
                            reject);
                }
                END_SAFE_REENTRANT_CALL
            }
            catch (const JavascriptException& err)
            {
                exception = err.GetAndClear();
            }
        }

        Assert(exception != nullptr);

        return TryRejectWithExceptionObject(exception, reject, scriptContext);
    }